

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::
RegisterTests(ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>
              *this)

{
  pointer psVar1;
  pointer pIVar2;
  ParamNameGeneratorFunc *pPVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
  _Var4;
  _Alloc_hider name;
  bool bVar5;
  int iVar6;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar7;
  size_type sVar8;
  char *pcVar9;
  undefined4 extraout_var_02;
  TestFactoryBase *factory;
  undefined4 extraout_var_03;
  pointer psVar10;
  size_type index;
  ulong uVar11;
  bool bVar12;
  GTestLog local_1b8;
  int local_1b4;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false> local_1b0;
  char *local_1a8;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false> local_1a0;
  string local_198;
  size_type local_178;
  bool *local_170;
  ParamGenerator<bool> generator;
  string test_name;
  string param_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_suite_name;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  
  test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
  test_suite_name._M_string_length = 0;
  bVar12 = false;
  test_suite_name.field_2._M_local_buf[0] = '\0';
  test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  test_name._M_string_length = 0;
  test_name.field_2._M_local_buf[0] = '\0';
  psVar10 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar10 == psVar1) {
      if (!bVar12) {
        iVar6 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_80,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_03,iVar6),&local_80,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_80);
      }
      std::__cxx11::string::~string((string *)&test_name);
      std::__cxx11::string::~string((string *)&test_suite_name);
      return;
    }
    pIVar2 = (this->instantiations_).
             super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::InstantiationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start; __lhs != pIVar2; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar3 = __lhs->name_func;
      local_1a8 = __lhs->file;
      local_1b4 = __lhs->line;
      if ((__lhs->name)._M_string_length == 0) {
        test_suite_name._M_string_length = 0;
        *test_suite_name._M_dataplus._M_p = '\0';
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar6 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1b0._M_head_impl = (ParamIteratorInterface<bool> *)CONCAT44(extraout_var,iVar6);
      iVar6 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
      local_1a0._M_head_impl = (ParamIteratorInterface<bool> *)CONCAT44(extraout_var_00,iVar6);
      local_178 = 0;
      while( true ) {
        bVar5 = ParamIterator<bool>::operator!=
                          ((ParamIterator<bool> *)&local_1b0,(ParamIterator<bool> *)&local_1a0);
        if (!bVar5) break;
        iVar6 = (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        local_170 = (bool *)CONCAT44(extraout_var_01,iVar6);
        test_name._M_string_length = 0;
        *test_name._M_dataplus._M_p = '\0';
        local_198._M_dataplus._M_p._0_1_ = *local_170;
        local_198._M_string_length = local_178;
        (*pPVar3)(&param_name,(TestParamInfo<bool> *)&local_198);
        if (param_name._M_string_length == 0) {
          bVar12 = false;
        }
        else {
          for (uVar11 = 0; bVar12 = param_name._M_string_length <= uVar11, !bVar12;
              uVar11 = uVar11 + 1) {
            bVar5 = IsAlNum(param_name._M_dataplus._M_p[uVar11]);
            if ((!bVar5) && (param_name._M_dataplus._M_p[uVar11] != '_')) break;
          }
        }
        bVar12 = IsTrue(bVar12);
        if (!bVar12) {
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x247);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,
                                   "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b4);
          poVar7 = std::operator<<(poVar7,"");
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_198);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&test_param_names,&param_name);
        bVar12 = IsTrue(sVar8 == 0);
        if (!bVar12) {
          GTestLog::GTestLog((GTestLog *)&local_198,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24d);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b4);
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_198);
        }
        if ((((psVar10->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->test_base_name)._M_string_length != 0) {
          pcVar9 = (char *)std::__cxx11::string::append((string *)&test_name);
          std::__cxx11::string::append(pcVar9);
        }
        std::__cxx11::string::append((string *)&test_name);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        std::__cxx11::string::string((string *)&local_a0,(string *)&test_suite_name);
        name = test_name._M_dataplus;
        PrintToString<bool>(&local_198,local_170);
        pcVar9 = (char *)CONCAT71(local_198._M_dataplus._M_p._1_7_,local_198._M_dataplus._M_p._0_1_)
        ;
        CodeLocation::CodeLocation
                  (&local_58,
                   &((psVar10->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->code_location);
        iVar6 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar12 = IsTrue(true);
        if (!bVar12) {
          GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b4);
          GTestLog::~GTestLog(&local_1b8);
        }
        bVar12 = IsTrue(true);
        if (!bVar12) {
          GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                  );
          poVar7 = std::operator<<(poVar7,local_1a8);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b4);
          GTestLog::~GTestLog(&local_1b8);
        }
        _Var4.super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_false>.
        _M_head_impl = (((psVar10->
                         super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->test_meta_factory)._M_t.
                       super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<bool>,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
                       .super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_false>
        ;
        factory = (TestFactoryBase *)
                  (**(code **)(*(long *)_Var4.
                                        super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_false>
                                        ._M_head_impl + 0x10))
                            (_Var4.
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<bool>_*,_false>
                             ._M_head_impl,*local_170);
        MakeAndRegisterTestInfo
                  (&local_a0,name._M_p,(char *)0x0,pcVar9,&local_58,
                   (TypeId)CONCAT44(extraout_var_02,iVar6),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,factory);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_a0);
        local_178 = local_178 + 1;
        std::__cxx11::string::~string((string *)&param_name);
        bVar12 = true;
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[3])();
      }
      if (local_1a0._M_head_impl != (ParamIteratorInterface<bool> *)0x0) {
        (*(local_1a0._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      if (local_1b0._M_head_impl != (ParamIteratorInterface<bool> *)0x0) {
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    psVar10 = psVar10 + 1;
  } while( true );
}

Assistant:

iterator end() const { return iterator(impl_->End()); }